

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseAbiTags(State *state)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  undefined2 local_4a;
  undefined6 uStack_48;
  undefined2 uStack_42;
  undefined6 uStack_40;
  undefined2 uStack_3a;
  undefined6 uStack_38;
  
  pcVar2 = state->mangled_cur;
  pcVar3 = state->out_cur;
  pcVar4 = state->out_begin;
  pcVar5 = state->out_end;
  uVar6 = *(undefined8 *)((long)&state->prev_name + 6);
  uStack_38 = (undefined6)((ulong)*(undefined8 *)((long)&state->out_end + 6) >> 0x10);
  local_4a = (undefined2)((ulong)pcVar3 >> 0x30);
  uStack_48 = SUB86(pcVar4,0);
  uStack_42 = (undefined2)((ulong)pcVar4 >> 0x30);
  uStack_40 = SUB86(pcVar5,0);
  uStack_3a = (undefined2)((ulong)pcVar5 >> 0x30);
  bVar8 = state->append;
  bVar1 = state->overflowed;
  state->append = false;
  bVar7 = OneOrMore(ParseAbiTag,state);
  if (bVar7) {
    bVar8 = (bool)(bVar8 & 1);
  }
  else {
    *(ulong *)((long)&state->out_cur + 6) = CONCAT62(uStack_48,local_4a);
    *(ulong *)((long)&state->out_begin + 6) = CONCAT62(uStack_40,uStack_42);
    *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_38,uStack_3a);
    *(undefined8 *)((long)&state->prev_name + 6) = uVar6;
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->overflowed = bVar1;
  }
  state->append = bVar8;
  return bVar7;
}

Assistant:

static bool ParseAbiTags(State *state) {
  State copy = *state;
  DisableAppend(state);
  if (OneOrMore(ParseAbiTag, state)) {
    RestoreAppend(state, copy.append);
    return true;
  }
  *state = copy;
  return false;
}